

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test::TestBody
          (MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_368;
  AssertHelper local_348;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  undefined1 local_160 [8];
  TestRequired msg2;
  TestRequired msg1;
  MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test *this_local;
  
  proto2_unittest::TestRequired::TestRequired((TestRequired *)((long)&msg2.field_0 + 0x90));
  proto2_unittest::TestRequired::TestRequired((TestRequired *)local_160);
  proto2_unittest::TestRequired::set_a((TestRequired *)((long)&msg2.field_0 + 0x90),0x191);
  proto2_unittest::TestRequired::set_a((TestRequired *)local_160,0x191);
  proto2_unittest::TestRequired::set_b((TestRequired *)local_160,0x192);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  util::MessageDifferencer::set_message_field_comparison
            ((MessageDifferencer *)&gtest_ar_.message_,EQUIVALENT);
  util::MessageDifferencer::set_scope((MessageDifferencer *)&gtest_ar_.message_,PARTIAL);
  local_331 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)&gtest_ar_.message_,
                         (Message *)((long)&msg2.field_0 + 0x90),(Message *)local_160);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_368,(internal *)local_330,(AssertionResult *)0x1ebd035,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x336,message);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  proto2_unittest::TestRequired::~TestRequired((TestRequired *)local_160);
  proto2_unittest::TestRequired::~TestRequired((TestRequired *)((long)&msg2.field_0 + 0x90));
  return;
}

Assistant:

TEST(MessageDifferencerTest, PartialEquivalencyTestSkipRequiredField) {
  // Create the testing protos
  unittest::TestRequired msg1;
  unittest::TestRequired msg2;

  msg1.set_a(401);
  msg2.set_a(401);
  msg2.set_b(402);

  // Compare
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}